

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

int xmlParseElementDecl(xmlParserCtxtPtr ctxt)

{
  int iVar1;
  int iVar2;
  xmlElementContentPtr pxStack_30;
  int inputid;
  xmlElementContentPtr content;
  xmlChar *pxStack_20;
  int ret;
  xmlChar *name;
  xmlParserCtxtPtr ctxt_local;
  
  content._4_4_ = -1;
  pxStack_30 = (xmlElementContentPtr)0x0;
  if ((((((*ctxt->input->cur == '<') && (ctxt->input->cur[1] == '!')) &&
        (ctxt->input->cur[2] == 'E')) &&
       ((ctxt->input->cur[3] == 'L' && (ctxt->input->cur[4] == 'E')))) &&
      (ctxt->input->cur[5] == 'M')) &&
     (((ctxt->input->cur[6] == 'E' && (ctxt->input->cur[7] == 'N')) && (ctxt->input->cur[8] == 'T'))
     )) {
    iVar1 = ctxt->input->id;
    ctxt->input->cur = ctxt->input->cur + 9;
    ctxt->input->col = ctxt->input->col + 9;
    name = (xmlChar *)ctxt;
    if (*ctxt->input->cur == '\0') {
      xmlParserInputGrow(ctxt->input,0xfa);
    }
    iVar2 = xmlSkipBlankChars((xmlParserCtxtPtr)name);
    if (iVar2 == 0) {
      xmlFatalErrMsg((xmlParserCtxtPtr)name,XML_ERR_SPACE_REQUIRED,
                     "Space required after \'ELEMENT\'\n");
      return -1;
    }
    pxStack_20 = xmlParseName((xmlParserCtxtPtr)name);
    if (pxStack_20 == (xmlChar *)0x0) {
      xmlFatalErrMsg((xmlParserCtxtPtr)name,XML_ERR_NAME_REQUIRED,
                     "xmlParseElementDecl: no name for Element\n");
      return -1;
    }
    iVar2 = xmlSkipBlankChars((xmlParserCtxtPtr)name);
    if (iVar2 == 0) {
      xmlFatalErrMsg((xmlParserCtxtPtr)name,XML_ERR_SPACE_REQUIRED,
                     "Space required after the element name\n");
    }
    if ((((**(char **)(*(long *)(name + 0x38) + 0x20) == 'E') &&
         (*(char *)(*(long *)(*(long *)(name + 0x38) + 0x20) + 1) == 'M')) &&
        (*(char *)(*(long *)(*(long *)(name + 0x38) + 0x20) + 2) == 'P')) &&
       ((*(char *)(*(long *)(*(long *)(name + 0x38) + 0x20) + 3) == 'T' &&
        (*(char *)(*(long *)(*(long *)(name + 0x38) + 0x20) + 4) == 'Y')))) {
      *(long *)(*(long *)(name + 0x38) + 0x20) = *(long *)(*(long *)(name + 0x38) + 0x20) + 5;
      *(int *)(*(long *)(name + 0x38) + 0x38) = *(int *)(*(long *)(name + 0x38) + 0x38) + 5;
      if (**(char **)(*(long *)(name + 0x38) + 0x20) == '\0') {
        xmlParserInputGrow(*(xmlParserInputPtr *)(name + 0x38),0xfa);
      }
      content._4_4_ = 1;
    }
    else if ((**(char **)(*(long *)(name + 0x38) + 0x20) == 'A') &&
            ((*(char *)(*(long *)(*(long *)(name + 0x38) + 0x20) + 1) == 'N' &&
             (*(char *)(*(long *)(*(long *)(name + 0x38) + 0x20) + 2) == 'Y')))) {
      *(long *)(*(long *)(name + 0x38) + 0x20) = *(long *)(*(long *)(name + 0x38) + 0x20) + 3;
      *(int *)(*(long *)(name + 0x38) + 0x38) = *(int *)(*(long *)(name + 0x38) + 0x38) + 3;
      if (**(char **)(*(long *)(name + 0x38) + 0x20) == '\0') {
        xmlParserInputGrow(*(xmlParserInputPtr *)(name + 0x38),0xfa);
      }
      content._4_4_ = 2;
    }
    else {
      if (**(char **)(*(long *)(name + 0x38) + 0x20) != '(') {
        if (((**(char **)(*(long *)(name + 0x38) + 0x20) == '%') && (*(int *)(name + 0x94) == 0)) &&
           (*(int *)(name + 0x40) == 1)) {
          xmlFatalErrMsg((xmlParserCtxtPtr)name,XML_ERR_PEREF_IN_INT_SUBSET,
                         "PEReference: forbidden within markup decl in internal subset\n");
        }
        else {
          xmlFatalErrMsg((xmlParserCtxtPtr)name,XML_ERR_ELEMCONTENT_NOT_STARTED,
                         "xmlParseElementDecl: \'EMPTY\', \'ANY\' or \'(\' expected\n");
        }
        return -1;
      }
      content._4_4_ =
           xmlParseElementContentDecl((xmlParserCtxtPtr)name,pxStack_20,&stack0xffffffffffffffd0);
    }
    xmlSkipBlankChars((xmlParserCtxtPtr)name);
    if (**(char **)(*(long *)(name + 0x38) + 0x20) == '>') {
      if (iVar1 != *(int *)(*(long *)(name + 0x38) + 100)) {
        xmlFatalErrMsg((xmlParserCtxtPtr)name,XML_ERR_ENTITY_BOUNDARY,
                       "Element declaration doesn\'t start and stop in the same entity\n");
      }
      xmlNextChar((xmlParserCtxtPtr)name);
      if (((*(long *)name == 0) || (*(int *)(name + 0x14c) != 0)) ||
         (*(long *)(*(long *)name + 0x48) == 0)) {
        if (pxStack_30 != (xmlElementContentPtr)0x0) {
          xmlFreeDocElementContent(*(xmlDocPtr *)(name + 0x10),pxStack_30);
        }
      }
      else {
        if (pxStack_30 != (xmlElementContentPtr)0x0) {
          pxStack_30->parent = (_xmlElementContent *)0x0;
        }
        (**(code **)(*(long *)name + 0x48))
                  (*(undefined8 *)(name + 8),pxStack_20,content._4_4_,pxStack_30);
        if ((pxStack_30 != (xmlElementContentPtr)0x0) &&
           (pxStack_30->parent == (_xmlElementContent *)0x0)) {
          xmlFreeDocElementContent(*(xmlDocPtr *)(name + 0x10),pxStack_30);
        }
      }
    }
    else {
      xmlFatalErr((xmlParserCtxtPtr)name,XML_ERR_GT_REQUIRED,(char *)0x0);
      if (pxStack_30 != (xmlElementContentPtr)0x0) {
        xmlFreeDocElementContent(*(xmlDocPtr *)(name + 0x10),pxStack_30);
      }
    }
  }
  return content._4_4_;
}

Assistant:

int
xmlParseElementDecl(xmlParserCtxtPtr ctxt) {
    const xmlChar *name;
    int ret = -1;
    xmlElementContentPtr content  = NULL;

    /* GROW; done in the caller */
    if (CMP9(CUR_PTR, '<', '!', 'E', 'L', 'E', 'M', 'E', 'N', 'T')) {
	int inputid = ctxt->input->id;

	SKIP(9);
	if (SKIP_BLANKS == 0) {
	    xmlFatalErrMsg(ctxt, XML_ERR_SPACE_REQUIRED,
		           "Space required after 'ELEMENT'\n");
	    return(-1);
	}
        name = xmlParseName(ctxt);
	if (name == NULL) {
	    xmlFatalErrMsg(ctxt, XML_ERR_NAME_REQUIRED,
			   "xmlParseElementDecl: no name for Element\n");
	    return(-1);
	}
	if (SKIP_BLANKS == 0) {
	    xmlFatalErrMsg(ctxt, XML_ERR_SPACE_REQUIRED,
			   "Space required after the element name\n");
	}
	if (CMP5(CUR_PTR, 'E', 'M', 'P', 'T', 'Y')) {
	    SKIP(5);
	    /*
	     * Element must always be empty.
	     */
	    ret = XML_ELEMENT_TYPE_EMPTY;
	} else if ((RAW == 'A') && (NXT(1) == 'N') &&
	           (NXT(2) == 'Y')) {
	    SKIP(3);
	    /*
	     * Element is a generic container.
	     */
	    ret = XML_ELEMENT_TYPE_ANY;
	} else if (RAW == '(') {
	    ret = xmlParseElementContentDecl(ctxt, name, &content);
	} else {
	    /*
	     * [ WFC: PEs in Internal Subset ] error handling.
	     */
	    if ((RAW == '%') && (ctxt->external == 0) &&
	        (ctxt->inputNr == 1)) {
		xmlFatalErrMsg(ctxt, XML_ERR_PEREF_IN_INT_SUBSET,
	  "PEReference: forbidden within markup decl in internal subset\n");
	    } else {
		xmlFatalErrMsg(ctxt, XML_ERR_ELEMCONTENT_NOT_STARTED,
		      "xmlParseElementDecl: 'EMPTY', 'ANY' or '(' expected\n");
            }
	    return(-1);
	}

	SKIP_BLANKS;

	if (RAW != '>') {
	    xmlFatalErr(ctxt, XML_ERR_GT_REQUIRED, NULL);
	    if (content != NULL) {
		xmlFreeDocElementContent(ctxt->myDoc, content);
	    }
	} else {
	    if (inputid != ctxt->input->id) {
		xmlFatalErrMsg(ctxt, XML_ERR_ENTITY_BOUNDARY,
                               "Element declaration doesn't start and stop in"
                               " the same entity\n");
	    }

	    NEXT;
	    if ((ctxt->sax != NULL) && (!ctxt->disableSAX) &&
		(ctxt->sax->elementDecl != NULL)) {
		if (content != NULL)
		    content->parent = NULL;
	        ctxt->sax->elementDecl(ctxt->userData, name, ret,
		                       content);
		if ((content != NULL) && (content->parent == NULL)) {
		    /*
		     * this is a trick: if xmlAddElementDecl is called,
		     * instead of copying the full tree it is plugged directly
		     * if called from the parser. Avoid duplicating the
		     * interfaces or change the API/ABI
		     */
		    xmlFreeDocElementContent(ctxt->myDoc, content);
		}
	    } else if (content != NULL) {
		xmlFreeDocElementContent(ctxt->myDoc, content);
	    }
	}
    }
    return(ret);
}